

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O1

VRDisplayNode *
MinVR::VRHeadTrackingNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  VRAnyCoreType VVar6;
  float *pfVar7;
  ostream *poVar8;
  VRHeadTrackingNode *this;
  VRMatrix4 M1;
  VRVector3 z;
  VRVector3 x;
  VRVector3 eye;
  VRVector3 y;
  string trackingEvent;
  VRMatrix4 headMatrix;
  VRVector3 center;
  VRVector3 up;
  VRMatrix4 M2;
  VRMatrix4 lookAtMatrix;
  undefined1 local_430 [72];
  float local_3e8;
  float local_3e4;
  float local_3e0;
  float local_3dc;
  float local_3d8;
  float local_3d4;
  VRVector3 local_3d0;
  VRVector3 local_3b8;
  VRVector3 local_3a0;
  string local_388;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  VRMainInterface *local_348;
  VRVector3 local_340;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [72];
  VRVector3 local_180;
  VRVector3 local_168;
  undefined1 local_150 [72];
  VRMatrix4 local_108;
  VRMatrix4 local_c0;
  VRMatrix4 local_78;
  
  local_348 = vrMain;
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"HeadTrackingEvent","");
  pcVar1 = (nameSpace->_M_dataplus)._M_p;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar1,pcVar1 + nameSpace->_M_string_length);
  VVar6 = VRDataIndex::getValue(config,(string *)local_1c8,&local_208,true);
  (*(VVar6.datum)->_vptr_VRDatum[2])(&local_1e8,VVar6.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  VRMatrix4::VRMatrix4((VRMatrix4 *)local_1c8);
  pcVar1 = local_430 + 0x10;
  local_430._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"HeadMatrix","");
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar2,pcVar2 + nameSpace->_M_string_length);
  bVar3 = VRDataIndex::exists(config,(string *)local_430,&local_228,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_430._0_8_ != pcVar1) {
    operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
  }
  if (bVar3) {
    local_150._0_8_ = local_150 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"HeadMatrix","");
    pcVar1 = (nameSpace->_M_dataplus)._M_p;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,pcVar1,pcVar1 + nameSpace->_M_string_length);
    VVar6 = VRDataIndex::getValue(config,(string *)local_150,&local_248,true);
    VRMatrix4::VRMatrix4((VRMatrix4 *)local_430,VVar6);
    VRMatrix4::operator=((VRMatrix4 *)local_1c8,(VRMatrix4 *)local_430);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    goto LAB_001486f7;
  }
  local_430._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"LookAtUp","");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,pcVar2,pcVar2 + nameSpace->_M_string_length);
  bVar3 = VRDataIndex::exists(config,(string *)local_430,&local_388,true);
  if (bVar3) {
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"LookAtEye","");
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    pcVar2 = (nameSpace->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,pcVar2,pcVar2 + nameSpace->_M_string_length);
    bVar4 = VRDataIndex::exists(config,&local_2e8,&local_308,true);
    if (!bVar4) goto LAB_00147fa6;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"LookAtCenter","");
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    pcVar2 = (nameSpace->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,pcVar2,pcVar2 + nameSpace->_M_string_length);
    bVar5 = VRDataIndex::exists(config,&local_328,&local_268,true);
    bVar4 = true;
  }
  else {
LAB_00147fa6:
    bVar4 = false;
    bVar5 = false;
  }
  if (bVar4) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_430._0_8_ != pcVar1) {
    operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
  }
  if (bVar5 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ",0x24);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(nameSpace->_M_dataplus)._M_p,
                        nameSpace->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 ",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  else {
    local_430._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"LookAtUp","");
    pcVar2 = (nameSpace->_M_dataplus)._M_p;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar2,pcVar2 + nameSpace->_M_string_length);
    VVar6 = VRDataIndex::getValue(config,(string *)local_430,&local_288,true);
    VRVector3::VRVector3(&local_168,VVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_430._0_8_ != pcVar1) {
      operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
    }
    local_430._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"LookAtEye","");
    pcVar2 = (nameSpace->_M_dataplus)._M_p;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,pcVar2,pcVar2 + nameSpace->_M_string_length);
    VVar6 = VRDataIndex::getValue(config,(string *)local_430,&local_2a8,true);
    VRVector3::VRVector3(&local_3a0,VVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_430._0_8_ != pcVar1) {
      operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
    }
    local_430._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"LookAtCenter","");
    pcVar2 = (nameSpace->_M_dataplus)._M_p;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,pcVar2,pcVar2 + nameSpace->_M_string_length);
    VVar6 = VRDataIndex::getValue(config,(string *)local_430,&local_2c8,true);
    VRVector3::VRVector3(&local_180,VVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_430._0_8_ != pcVar1) {
      operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
    }
    operator-(&local_3d0,&local_3a0,&local_180);
    VRVector3::normalize((VRVector3 *)local_430,&local_3d0);
    VRVector3::operator=(&local_3d0,(VRVector3 *)local_430);
    VRVector3::~VRVector3((VRVector3 *)local_430);
    VRVector3::cross(&local_3b8,&local_168,&local_3d0);
    VRVector3::normalize((VRVector3 *)local_430,&local_3b8);
    VRVector3::operator=(&local_3b8,(VRVector3 *)local_430);
    VRVector3::~VRVector3((VRVector3 *)local_430);
    VRVector3::cross(&local_340,&local_3d0,&local_3b8);
    pfVar7 = VRVector3::operator[](&local_3b8,0);
    local_358._0_4_ = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_340,0);
    local_368._0_4_ = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_3d0,0);
    local_3d4 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_3b8,1);
    local_3d8 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_340,1);
    local_3dc = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_3d0,1);
    local_3e0 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_3b8,2);
    local_3e4 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_340,2);
    local_3e8 = *pfVar7;
    pfVar7 = VRVector3::operator[](&local_3d0,2);
    VRMatrix4::fromRowMajorElements
              ((VRMatrix4 *)local_430,(float)local_358._0_4_,(float)local_368._0_4_,local_3d4,0.0,
               local_3d8,local_3dc,local_3e0,0.0,local_3e4,local_3e8,*pfVar7,0.0,0.0,0.0,0.0,1.0);
    pfVar7 = VRVector3::operator[](&local_3a0,0);
    local_358 = ZEXT416((uint)*pfVar7);
    pfVar7 = VRVector3::operator[](&local_3a0,1);
    local_368 = ZEXT416((uint)*pfVar7);
    pfVar7 = VRVector3::operator[](&local_3a0,2);
    VRMatrix4::fromRowMajorElements
              ((VRMatrix4 *)local_150,1.0,0.0,0.0,-(float)local_358._0_4_,0.0,1.0,0.0,
               -(float)local_368._0_4_,0.0,0.0,1.0,-*pfVar7,0.0,0.0,0.0,1.0);
    operator*(&local_78,(VRMatrix4 *)local_430,(VRMatrix4 *)local_150);
    VRMatrix4::inverse(&local_c0,&local_78);
    VRMatrix4::operator=((VRMatrix4 *)local_1c8,&local_c0);
    VRMatrix4::~VRMatrix4(&local_c0);
    VRMatrix4::~VRMatrix4(&local_78);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_150);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_430);
    VRVector3::~VRVector3(&local_340);
    VRVector3::~VRVector3(&local_3b8);
    VRVector3::~VRVector3(&local_3d0);
    VRVector3::~VRVector3(&local_180);
    VRVector3::~VRVector3(&local_3a0);
    VRVector3::~VRVector3(&local_168);
  }
LAB_001486f7:
  this = (VRHeadTrackingNode *)operator_new(0xe0);
  VRMatrix4::VRMatrix4(&local_108,(VRMatrix4 *)local_1c8);
  VRHeadTrackingNode(this,nameSpace,&local_1e8,&local_108);
  VRMatrix4::~VRMatrix4(&local_108);
  (**local_348->_vptr_VRMainInterface)(local_348,&this->super_VREventHandler);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRHeadTrackingNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {

	std::string trackingEvent = config->getValue("HeadTrackingEvent", nameSpace);
	VRMatrix4 headMatrix;

	if (config->exists("HeadMatrix", nameSpace)){
		headMatrix = config->getValue("HeadMatrix", nameSpace);
	}
	else if (config->exists("LookAtUp", nameSpace) && config->exists("LookAtEye", nameSpace) && config->exists("LookAtCenter", nameSpace))
	{
		VRVector3 up = config->getValue("LookAtUp", nameSpace);
		VRVector3 eye = config->getValue("LookAtEye", nameSpace);
		VRVector3 center = config->getValue("LookAtCenter", nameSpace);

        VRVector3 z = eye - center;
		z = z.normalize();
		VRVector3 x = up.cross(z);
		x = x.normalize();
		VRVector3 y = z.cross(x);

        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);

        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);

		VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
	}
	else
	{
		std::cerr << "Warning : no HeadMatrix defined for " << nameSpace << std::endl;
		std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
		std::cerr << "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 " << std::endl;
	}

	VRHeadTrackingNode *node = new VRHeadTrackingNode(nameSpace, trackingEvent, headMatrix);

	vrMain->addEventHandler(node);

	return node;
}